

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryEmitGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::geometry::anon_unknown_0::EmitTest::initPrograms
          (EmitTest *this,SourceCollections *sourceCollections)

{
  ostream *poVar1;
  ProgramSources *pPVar2;
  string local_4d8;
  ShaderSource local_4b8;
  allocator<char> local_489;
  string local_488;
  ostringstream local_468 [8];
  ostringstream src_1;
  string local_2f0;
  ShaderSource local_2d0;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  ShaderSource local_260;
  allocator<char> local_231;
  string local_230;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  SourceCollections *sourceCollections_local;
  EmitTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"#version 310 es\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in highp vec4 a_position;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 1) in highp vec4 a_color;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out highp vec4 v_geom_FragColor;\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tgl_Position = a_position;\n");
  poVar1 = std::operator<<(poVar1,"\tv_geom_FragColor = a_color;\n");
  std::operator<<(poVar1,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"vertex",&local_1c1);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(pPVar2,&local_1f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"geometry",&local_231);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_230);
  geometry::(anonymous_namespace)::EmitTest::shaderGeometry_abi_cxx11_(&local_280,this,false);
  glu::GeometrySource::GeometrySource((GeometrySource *)&local_260,&local_280);
  glu::ProgramSources::operator<<(pPVar2,&local_260);
  glu::GeometrySource::~GeometrySource((GeometrySource *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  if ((this->m_emitTestSpec).primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"geometry_pointsize",&local_2a1);
    pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&sourceCollections->glslSources,&local_2a0);
    geometry::(anonymous_namespace)::EmitTest::shaderGeometry_abi_cxx11_(&local_2f0,this,true);
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_2d0,&local_2f0);
    glu::ProgramSources::operator<<(pPVar2,&local_2d0);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
  }
  std::__cxx11::ostringstream::ostringstream(local_468);
  poVar1 = std::operator<<((ostream *)local_468,"#version 310 es\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out mediump vec4 fragColor;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in highp vec4 v_frag_FragColor;\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tfragColor = v_frag_FragColor;\n");
  std::operator<<(poVar1,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"fragment",&local_489);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_488);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_4b8,&local_4d8);
  glu::ProgramSources::operator<<(pPVar2,&local_4b8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::ostringstream::~ostringstream(local_468);
  return;
}

Assistant:

void EmitTest::initPrograms (SourceCollections& sourceCollections) const
{
	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<< "layout(location = 0) in highp vec4 a_position;\n"
			<< "layout(location = 1) in highp vec4 a_color;\n"
			<< "layout(location = 0) out highp vec4 v_geom_FragColor;\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "	gl_Position = a_position;\n"
			<< "	v_geom_FragColor = a_color;\n"
			<< "}\n";
		sourceCollections.glslSources.add("vertex") << glu::VertexSource(src.str());
	}

	{
		sourceCollections.glslSources.add("geometry") << glu::GeometrySource(shaderGeometry(false));
		if(m_emitTestSpec.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
			sourceCollections.glslSources.add("geometry_pointsize") << glu::GeometrySource(shaderGeometry(true));
	}

	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<< "layout(location = 0) out mediump vec4 fragColor;\n"
			<< "layout(location = 0) in highp vec4 v_frag_FragColor;\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "	fragColor = v_frag_FragColor;\n"
			<<"}\n";
		sourceCollections.glslSources.add("fragment") << glu::FragmentSource(src.str());
	}
}